

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O3

void HTS_Engine_save_label(HTS_Engine *engine,FILE *fp)

{
  HTS_Label *label;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined8 local_78;
  undefined8 local_68;
  
  label = &engine->label;
  sVar1 = HTS_ModelSet_get_nstate(&engine->ms);
  sVar8 = (engine->condition).fperiod;
  sVar3 = (engine->condition).sampling_frequency;
  sVar2 = HTS_Label_get_size(label);
  if (sVar2 != 0) {
    local_78._0_4_ = (undefined4)sVar8;
    local_78._4_4_ = (undefined4)(sVar8 >> 0x20);
    local_68._0_4_ = (undefined4)sVar3;
    local_68._4_4_ = (undefined4)(sVar3 >> 0x20);
    dVar14 = ((((double)CONCAT44(0x45300000,local_78._4_4_) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)local_78) - 4503599627370496.0)) * 10000000.0
             ) / (((double)CONCAT44(0x45300000,local_68._4_4_) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(undefined4)local_68) - 4503599627370496.0));
    lVar9 = 0;
    local_68 = 0;
    local_78 = 0;
    do {
      if (sVar1 == 0) {
        lVar7 = 0;
      }
      else {
        sVar8 = 0;
        lVar7 = 0;
        do {
          sVar3 = HTS_SStreamSet_get_duration(&engine->sss,lVar9 + sVar8);
          lVar7 = lVar7 + sVar3;
          sVar8 = sVar8 + 1;
        } while (sVar1 != sVar8);
      }
      auVar10._8_4_ = (int)((ulong)local_78 >> 0x20);
      auVar10._0_8_ = local_78;
      auVar10._12_4_ = 0x45300000;
      dVar12 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) * dVar14;
      uVar4 = (ulong)dVar12;
      local_78 = local_78 + lVar7;
      auVar11._8_4_ = (int)((ulong)local_78 >> 0x20);
      auVar11._0_8_ = local_78;
      auVar11._12_4_ = 0x45300000;
      dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) * dVar14;
      uVar6 = (ulong)dVar13;
      pcVar5 = HTS_Label_get_string(label,local_68);
      fprintf((FILE *)fp,"%lu %lu %s\n",
              (long)(dVar12 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,
              (long)(dVar13 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,pcVar5);
      local_68 = local_68 + 1;
      sVar8 = HTS_Label_get_size(label);
      lVar9 = lVar9 + sVar1;
    } while (local_68 < sVar8);
  }
  return;
}

Assistant:

void HTS_Engine_save_label(HTS_Engine * engine, FILE * fp)
{
   size_t i, j;
   size_t frame, state, duration;

   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   size_t nstate = HTS_ModelSet_get_nstate(&engine->ms);
   double rate = engine->condition.fperiod * 1.0e+07 / engine->condition.sampling_frequency;

   for (i = 0, state = 0, frame = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 0, duration = 0; j < nstate; j++)
         duration += HTS_SStreamSet_get_duration(sss, state++);
      fprintf(fp, "%lu %lu %s\n", (unsigned long) (frame * rate), (unsigned long) ((frame + duration) * rate), HTS_Label_get_string(label, i));
      frame += duration;
   }
}